

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_rep(lua_State *L)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__src;
  ulong uVar3;
  char *__src_00;
  char *__dest;
  size_t sz;
  size_t lsep;
  size_t l;
  luaL_Buffer b;
  
  iVar2 = 1;
  __src = luaL_checklstring(L,1,&l);
  uVar3 = luaL_checkinteger(L,2);
  __src_00 = luaL_optlstring(L,3,"",&lsep);
  if ((long)uVar3 < 1) {
    lua_pushstring(L,"");
  }
  else if ((CARRY8(lsep,l)) ||
          (auVar1._8_8_ = 0, auVar1._0_8_ = uVar3,
          SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar1,0) < lsep + l)) {
    iVar2 = luaL_error(L,"resulting string too large");
  }
  else {
    sz = lsep * (uVar3 - 1) + l * uVar3;
    __dest = luaL_buffinitsize(L,&b,sz);
    while( true ) {
      memcpy(__dest,__src,l);
      if ((long)uVar3 < 2) break;
      __dest = __dest + l;
      if (lsep != 0) {
        memcpy(__dest,__src_00,lsep);
        __dest = __dest + lsep;
      }
      uVar3 = uVar3 - 1;
    }
    luaL_pushresultsize(&b,sz);
  }
  return iVar2;
}

Assistant:

static int str_rep(lua_State *L) {
    size_t l, lsep;
    const char *s = luaL_checklstring(L, 1, &l);
    lua_Integer n = luaL_checkinteger(L, 2);
    const char *sep = luaL_optlstring(L, 3, "", &lsep);
    if (n <= 0) lua_pushliteral(L, "");
    else if (l + lsep < l || l + lsep > MAXSIZE / n)  /* may overflow? */
        return luaL_error(L, "resulting string too large");
    else {
        size_t totallen = (size_t) n * l + (size_t) (n - 1) * lsep;
        luaL_Buffer b;
        char *p = luaL_buffinitsize(L, &b, totallen);
        while (n-- > 1) {  /* first n-1 copies (followed by separator) */
            memcpy(p, s, l * sizeof(char));
            p += l;
            if (lsep > 0) {  /* empty 'memcpy' is not that cheap */
                memcpy(p, sep, lsep * sizeof(char));
                p += lsep;
            }
        }
        memcpy(p, s, l * sizeof(char));  /* last copy (not followed by separator) */
        luaL_pushresultsize(&b, totallen);
    }
    return 1;
}